

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeString::UnicodeString(UnicodeString *this,UnicodeString *that,int32_t srcStart)

{
  int32_t srcStart_local;
  UnicodeString *that_local;
  UnicodeString *this_local;
  
  Replaceable::Replaceable(&this->super_Replaceable);
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_004f0028
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  setTo(this,that,srcStart);
  return;
}

Assistant:

UnicodeString::UnicodeString(const UnicodeString& that,
                             int32_t srcStart) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  setTo(that, srcStart);
}